

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitFactoredDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
PlanningUnitFactoredDecPOMDPDiscrete::SetProblem
          (PlanningUnitFactoredDecPOMDPDiscrete *this,FactoredDecPOMDPDiscreteInterface *p)

{
  PlanningUnitDecPOMDPDiscrete *pPVar1;
  PlanningUnitDecPOMDPDiscrete *in_RSI;
  PlanningUnitFactoredDecPOMDPDiscrete *in_RDI;
  DecPOMDPDiscreteInterface *p2;
  DecPOMDPDiscreteInterface *local_30;
  PlanningUnitDecPOMDPDiscrete *this_00;
  
  this_00 = in_RSI;
  pPVar1 = (PlanningUnitDecPOMDPDiscrete *)GetFDPOMDPD(in_RDI);
  if (in_RSI != pPVar1) {
    in_RDI->_m_fDecPOMDP = (FactoredDecPOMDPDiscreteInterface *)this_00;
    local_30 = (DecPOMDPDiscreteInterface *)0x0;
    if (this_00 != (PlanningUnitDecPOMDPDiscrete *)0x0) {
      local_30 = (DecPOMDPDiscreteInterface *)
                 ((long)&(this_00->super_PlanningUnitMADPDiscrete).super_PlanningUnit.
                         _vptr_PlanningUnit +
                 (long)(this_00->super_PlanningUnitMADPDiscrete).super_PlanningUnit.
                       _vptr_PlanningUnit[-0x1e]);
    }
    PlanningUnitDecPOMDPDiscrete::SetProblem(this_00,local_30);
  }
  return;
}

Assistant:

void PlanningUnitFactoredDecPOMDPDiscrete::SetProblem(FactoredDecPOMDPDiscreteInterface* p)
{
    if(p == GetFDPOMDPD())
        return;

    _m_fDecPOMDP = p;
    //set (and initialize) the problem at PlanningUnitDecPOMDPDiscrete level:
    DecPOMDPDiscreteInterface* p2 = static_cast<DecPOMDPDiscreteInterface*>(p);
    PlanningUnitDecPOMDPDiscrete::SetProblem(p2);
}